

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_output_variable_initializer(CompilerGLSL *this,SPIRVariable *var)

{
  ID *ts;
  size_t *psVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  ExecutionModel EVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  SPIRFunction *pSVar8;
  SPIRType *type;
  SPIRType *pSVar9;
  SPIRConstant *pSVar10;
  SPIRConstant *pSVar11;
  code *pcVar12;
  bool bVar13;
  char (*in_R8) [6];
  uint32_t j;
  ulong uVar14;
  SmallVector<std::function<void_()>,_0UL> *this_00;
  char (*in_stack_fffffffffffffc78) [6];
  uint32_t local_37c;
  undefined1 local_375;
  uint32_t array_size;
  SPIRVariable *local_370;
  string lut_name;
  string local_330;
  SmallVector<std::function<void_()>,_0UL> *local_310;
  ID *local_308;
  size_t local_300;
  SPIRType array_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  exprs;
  string local_70;
  string local_50;
  
  pSVar8 = Compiler::get<spirv_cross::SPIRFunction>
                     (&this->super_Compiler,(this->super_Compiler).ir.default_entry_point.id);
  type = Compiler::get<spirv_cross::SPIRType>
                   (&this->super_Compiler,*(uint32_t *)&(var->super_IVariant).field_0xc);
  ts = &(var->super_IVariant).self;
  local_370 = var;
  bVar3 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationPatch);
  bVar4 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(type->super_IVariant).self.id,DecorationBlock);
  EVar5 = Compiler::get_execution_model(&this->super_Compiler);
  bVar13 = !bVar3 && EVar5 == ExecutionModelTessellationControl;
  if (bVar4) {
    sVar2 = (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    local_300 = (type->array).super_VectorView<unsigned_int>.buffer_size;
    array_size = 1;
    local_375 = local_300 == 1;
    local_308 = ts;
    if ((bool)local_375) {
      array_size = to_array_size_literal(this,type);
    }
    uVar7 = array_size;
    if (bVar13) {
      uVar7 = 1;
    }
    this_00 = &pSVar8->fixup_hooks_in;
    psVar1 = &array_type.array.buffer_capacity;
    local_310 = this_00;
    for (local_37c = 0; local_37c < (uint)sVar2; local_37c = local_37c + 1) {
      bVar4 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,local_37c,
                         DecorationBuiltIn);
      if ((!bVar4) ||
         (((uVar6 = Compiler::get_member_decoration
                              (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,
                               local_37c,DecorationBuiltIn), uVar6 != 4 ||
           ((this->super_Compiler).cull_distance_count != 0)) &&
          ((uVar6 = Compiler::get_member_decoration
                              (&this->super_Compiler,(TypeID)(type->super_IVariant).self.id,
                               local_37c,DecorationBuiltIn), uVar6 != 3 ||
           ((this->super_Compiler).clip_distance_count != 0)))))) {
        lut_name._M_string_length = 0;
        lut_name._M_dataplus._M_p = (pointer)&lut_name.field_2;
        lut_name.field_2._M_allocated_capacity =
             lut_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
        if (local_300 == 1) {
          join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[2],unsigned_int&,char_const(&)[6]>
                    ((string *)&array_type,(spirv_cross *)0x3835c0,(char (*) [2])local_308,
                     (TypedID<(spirv_cross::Types)0> *)0x3835c0,(char (*) [2])&local_37c,
                     (uint *)"_init",in_stack_fffffffffffffc78);
          ::std::__cxx11::string::operator=((string *)&lut_name,(string *)&array_type);
          ::std::__cxx11::string::~string((string *)&array_type);
          pSVar9 = Compiler::get<spirv_cross::SPIRType>
                             (&this->super_Compiler,
                              *(uint32_t *)&(local_370->super_IVariant).field_0xc);
          uVar6 = (pSVar9->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[local_37c].id;
          pSVar9 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar6);
          SPIRType::SPIRType(&array_type,pSVar9);
          array_type.parent_type.id = uVar6;
          SmallVector<unsigned_int,_8UL>::push_back(&array_type.array,&array_size);
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT71(exprs.
                          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          .ptr._1_7_,1);
          SmallVector<bool,_8UL>::push_back(&array_type.array_size_literal,(bool *)&exprs);
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size = 0;
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &exprs.stack_storage;
          exprs.buffer_capacity = 8;
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::reserve(&exprs,(ulong)array_size);
          pSVar10 = Compiler::get<spirv_cross::SPIRConstant>
                              (&this->super_Compiler,(local_370->initializer).id);
          for (uVar14 = 0; uVar14 < array_size; uVar14 = uVar14 + 1) {
            pSVar11 = Compiler::get<spirv_cross::SPIRConstant>
                                (&this->super_Compiler,
                                 (pSVar10->subconstants).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                                 [uVar14].id);
            to_expression_abi_cxx11_
                      (&local_330,this,
                       (pSVar11->subconstants).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr[local_37c]
                       .id,true);
            SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
            ::push_back(&exprs,&local_330);
            ::std::__cxx11::string::~string((string *)&local_330);
          }
          (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_330,this,&array_type,0);
          (*(this->super_Compiler)._vptr_Compiler[0x25])(&local_1a8,this,&array_type);
          this_00 = local_310;
          type_to_glsl_constructor_abi_cxx11_(&local_70,this,&array_type);
          merge(&local_50,&exprs,", ");
          statement<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3]>
                    (this,(char (*) [7])0x38a3f5,&local_330,(char (*) [2])0x37fb8c,&lut_name,
                     &local_1a8,(char (*) [4])0x395f16,&local_70,(char (*) [2])0x3965df,&local_50,
                     (char (*) [3])0x37e4de);
          ::std::__cxx11::string::~string((string *)&local_50);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_1a8);
          ::std::__cxx11::string::~string((string *)&local_330);
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          ::~SmallVector(&exprs);
          SPIRType::~SPIRType(&array_type);
        }
        for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
          array_type.super_IVariant._vptr_IVariant = (_func_int **)local_370;
          array_type.width._0_1_ = bVar13;
          array_type.vecsize = local_37c;
          array_type.columns._1_1_ = local_375;
          array_type.columns._0_1_ = bVar3;
          array_type._28_4_ = uVar6;
          array_type.super_IVariant._8_8_ = this;
          ::std::__cxx11::string::string((string *)&array_type.array,(string *)&lut_name);
          exprs.buffer_capacity = 0;
          exprs.stack_storage.aligned_char[0] = '\0';
          exprs.stack_storage.aligned_char[1] = '\0';
          exprs.stack_storage.aligned_char[2] = '\0';
          exprs.stack_storage.aligned_char[3] = '\0';
          exprs.stack_storage.aligned_char[4] = '\0';
          exprs.stack_storage.aligned_char[5] = '\0';
          exprs.stack_storage.aligned_char[6] = '\0';
          exprs.stack_storage.aligned_char[7] = '\0';
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .buffer_size = 0;
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 operator_new(0x40);
          ((exprs.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .ptr)->field_2)._M_allocated_capacity = array_type._16_8_;
          *(undefined8 *)
           ((long)&(exprs.
                    super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .ptr)->field_2 + 8) = array_type._24_8_;
          ((exprs.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .ptr)->_M_dataplus)._M_p = (pointer)array_type.super_IVariant._vptr_IVariant;
          (exprs.
           super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr)->_M_string_length = array_type.super_IVariant._8_8_;
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr[1]._M_dataplus._M_p =
               (pointer)&exprs.
                         super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         .ptr[1].field_2;
          if ((size_t *)array_type.array.super_VectorView<unsigned_int>.ptr == psVar1) {
            exprs.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr[1].field_2._M_allocated_capacity = array_type.array.buffer_capacity;
            *(undefined8 *)
             ((long)&exprs.
                     super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     .ptr[1].field_2 + 8) = array_type.array.stack_storage.aligned_char._0_8_;
          }
          else {
            exprs.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr[1]._M_dataplus._M_p = (pointer)array_type.array.super_VectorView<unsigned_int>.ptr;
            exprs.
            super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .ptr[1].field_2._M_allocated_capacity = array_type.array.buffer_capacity;
          }
          exprs.
          super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .ptr[1]._M_string_length = array_type.array.super_VectorView<unsigned_int>.buffer_size;
          array_type.array.super_VectorView<unsigned_int>.buffer_size = 0;
          array_type.array.buffer_capacity = array_type.array.buffer_capacity & 0xffffffffffffff00;
          exprs.stack_storage.aligned_char._0_8_ =
               ::std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp:3849:41)>
               ::_M_invoke;
          exprs.buffer_capacity =
               (size_t)::std::
                       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp:3849:41)>
                       ::_M_manager;
          array_type.array.super_VectorView<unsigned_int>.ptr = (uint *)psVar1;
          SmallVector<std::function<void_()>,_0UL>::push_back(this_00,(function<void_()> *)&exprs);
          ::std::_Function_base::~_Function_base((_Function_base *)&exprs);
          ::std::__cxx11::string::~string((string *)&array_type.array);
        }
        ::std::__cxx11::string::~string((string *)&lut_name);
      }
    }
  }
  else {
    if (!bVar3 && EVar5 == ExecutionModelTessellationControl) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
                ((string *)&exprs,(spirv_cross *)0x3835c0,(char (*) [2])ts,
                 (TypedID<(spirv_cross::Types)0> *)"_init",in_R8);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&array_type,this,type,0);
      (*(this->super_Compiler)._vptr_Compiler[0x25])(&lut_name,this,type);
      to_expression_abi_cxx11_(&local_330,this,(local_370->initializer).id,true);
      statement<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (this,(char (*) [7])0x38a3f5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&array_type,
                 (char (*) [2])0x37fb8c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exprs,
                 &lut_name,(char (*) [4])0x395f16,&local_330,(char (*) [2])0x37e4df);
      ::std::__cxx11::string::~string((string *)&local_330);
      ::std::__cxx11::string::~string((string *)&lut_name);
      ::std::__cxx11::string::~string((string *)&array_type);
      ::std::__cxx11::string::string((string *)&array_type,(string *)&exprs);
      array_type.array.super_VectorView<unsigned_int>.buffer_size = (size_t)local_370;
      lut_name._M_dataplus._M_p = (pointer)0x0;
      lut_name._M_string_length = 0;
      lut_name.field_2._M_allocated_capacity = 0;
      lut_name.field_2._8_8_ = 0;
      array_type.array.super_VectorView<unsigned_int>.ptr = (uint *)this;
      lut_name._M_dataplus._M_p = (pointer)operator_new(0x30);
      *(long **)lut_name._M_dataplus._M_p = (long *)((long)lut_name._M_dataplus._M_p + 0x10);
      if (array_type.super_IVariant._vptr_IVariant == (_func_int **)&array_type.width) {
        *(long *)((long)lut_name._M_dataplus._M_p + 0x10) = array_type._16_8_;
        *(undefined8 *)((long)lut_name._M_dataplus._M_p + 0x18) = array_type._24_8_;
      }
      else {
        *(_func_int ***)lut_name._M_dataplus._M_p = array_type.super_IVariant._vptr_IVariant;
        *(undefined8 *)((long)lut_name._M_dataplus._M_p + 0x10) = array_type._16_8_;
      }
      *(undefined8 *)((long)lut_name._M_dataplus._M_p + 8) = array_type.super_IVariant._8_8_;
      *(uint **)((long)lut_name._M_dataplus._M_p + 0x20) =
           array_type.array.super_VectorView<unsigned_int>.ptr;
      *(size_t *)((long)lut_name._M_dataplus._M_p + 0x28) =
           array_type.array.super_VectorView<unsigned_int>.buffer_size;
      lut_name.field_2._8_8_ =
           ::std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp:3904:39)>
           ::_M_invoke;
      pcVar12 = ::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp:3904:39)>
                ::_M_manager;
    }
    else {
      bVar4 = Compiler::has_decoration(&this->super_Compiler,(ID)ts->id,DecorationBuiltIn);
      if ((bVar4) &&
         (uVar7 = Compiler::get_decoration(&this->super_Compiler,(ID)ts->id,DecorationBuiltIn),
         uVar7 == 0x14)) {
        array_type.super_IVariant._8_8_ = local_370;
        array_type._24_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp:3912:39)>
             ::_M_invoke;
        array_type._16_8_ =
             ::std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp:3912:39)>
             ::_M_manager;
        array_type.super_IVariant._vptr_IVariant = (_func_int **)this;
        SmallVector<std::function<void_()>,_0UL>::push_back
                  (&pSVar8->fixup_hooks_in,(function<void_()> *)&array_type);
        ::std::_Function_base::~_Function_base((_Function_base *)&array_type);
        return;
      }
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&,char_const(&)[6]>
                ((string *)&exprs,(spirv_cross *)0x3835c0,(char (*) [2])ts,
                 (TypedID<(spirv_cross::Types)0> *)"_init",in_R8);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(&array_type,this,type,0);
      (*(this->super_Compiler)._vptr_Compiler[0x25])(&lut_name,this,type);
      to_expression_abi_cxx11_(&local_330,this,(local_370->initializer).id,true);
      statement<char_const(&)[7],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
                (this,(char (*) [7])0x38a3f5,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&array_type,
                 (char (*) [2])0x37fb8c,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&exprs,
                 &lut_name,(char (*) [4])0x395f16,&local_330,(char (*) [2])0x37e4df);
      ::std::__cxx11::string::~string((string *)&local_330);
      ::std::__cxx11::string::~string((string *)&lut_name);
      ::std::__cxx11::string::~string((string *)&array_type);
      ::std::__cxx11::string::string((string *)&array_type,(string *)&exprs);
      array_type.array.super_VectorView<unsigned_int>.ptr =
           (uint *)CONCAT71(array_type.array.super_VectorView<unsigned_int>.ptr._1_7_,bVar3);
      array_type.array.buffer_capacity = (size_t)local_370;
      lut_name._M_dataplus._M_p = (pointer)0x0;
      lut_name._M_string_length = 0;
      lut_name.field_2._M_allocated_capacity = 0;
      lut_name.field_2._8_8_ = 0;
      array_type.array.super_VectorView<unsigned_int>.buffer_size = (size_t)this;
      lut_name._M_dataplus._M_p = (pointer)operator_new(0x38);
      *(long **)lut_name._M_dataplus._M_p = (long *)((long)lut_name._M_dataplus._M_p + 0x10);
      if (array_type.super_IVariant._vptr_IVariant == (_func_int **)&array_type.width) {
        *(long *)((long)lut_name._M_dataplus._M_p + 0x10) = array_type._16_8_;
        *(undefined8 *)((long)lut_name._M_dataplus._M_p + 0x18) = array_type._24_8_;
      }
      else {
        *(_func_int ***)lut_name._M_dataplus._M_p = array_type.super_IVariant._vptr_IVariant;
        *(undefined8 *)((long)lut_name._M_dataplus._M_p + 0x10) = array_type._16_8_;
      }
      *(undefined8 *)((long)lut_name._M_dataplus._M_p + 8) = array_type.super_IVariant._8_8_;
      *(size_t *)((long)lut_name._M_dataplus._M_p + 0x30) = array_type.array.buffer_capacity;
      *(uint **)((long)lut_name._M_dataplus._M_p + 0x20) =
           array_type.array.super_VectorView<unsigned_int>.ptr;
      *(size_t *)((long)lut_name._M_dataplus._M_p + 0x28) =
           array_type.array.super_VectorView<unsigned_int>.buffer_size;
      lut_name.field_2._8_8_ =
           ::std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp:3928:39)>
           ::_M_invoke;
      pcVar12 = ::std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Unity-Technologies[P]SPIRV-Cross/spirv_glsl.cpp:3928:39)>
                ::_M_manager;
    }
    array_type.super_IVariant._vptr_IVariant = (_func_int **)&array_type.width;
    array_type._16_8_ = array_type._16_8_ & 0xffffffffffffff00;
    array_type.super_IVariant.self.id = 0;
    array_type.super_IVariant._12_4_ = 0;
    lut_name.field_2._M_allocated_capacity = (size_type)pcVar12;
    SmallVector<std::function<void_()>,_0UL>::push_back
              (&pSVar8->fixup_hooks_in,(function<void_()> *)&lut_name);
    ::std::_Function_base::~_Function_base((_Function_base *)&lut_name);
    ::std::__cxx11::string::~string((string *)&array_type);
    ::std::__cxx11::string::~string((string *)&exprs);
  }
  return;
}

Assistant:

void CompilerGLSL::emit_output_variable_initializer(const SPIRVariable &var)
{
	// If a StorageClassOutput variable has an initializer, we need to initialize it in main().
	auto &entry_func = this->get<SPIRFunction>(ir.default_entry_point);
	auto &type = get<SPIRType>(var.basetype);
	bool is_patch = has_decoration(var.self, DecorationPatch);
	bool is_block = has_decoration(type.self, DecorationBlock);
	bool is_control_point = get_execution_model() == ExecutionModelTessellationControl && !is_patch;

	if (is_block)
	{
		uint32_t member_count = uint32_t(type.member_types.size());
		bool type_is_array = type.array.size() == 1;
		uint32_t array_size = 1;
		if (type_is_array)
			array_size = to_array_size_literal(type);
		uint32_t iteration_count = is_control_point ? 1 : array_size;

		// If the initializer is a block, we must initialize each block member one at a time.
		for (uint32_t i = 0; i < member_count; i++)
		{
			// These outputs might not have been properly declared, so don't initialize them in that case.
			if (has_member_decoration(type.self, i, DecorationBuiltIn))
			{
				if (get_member_decoration(type.self, i, DecorationBuiltIn) == BuiltInCullDistance &&
				    !cull_distance_count)
					continue;

				if (get_member_decoration(type.self, i, DecorationBuiltIn) == BuiltInClipDistance &&
				    !clip_distance_count)
					continue;
			}

			// We need to build a per-member array first, essentially transposing from AoS to SoA.
			// This code path hits when we have an array of blocks.
			string lut_name;
			if (type_is_array)
			{
				lut_name = join("_", var.self, "_", i, "_init");
				uint32_t member_type_id = get<SPIRType>(var.basetype).member_types[i];
				auto &member_type = get<SPIRType>(member_type_id);
				auto array_type = member_type;
				array_type.parent_type = member_type_id;
				array_type.array.push_back(array_size);
				array_type.array_size_literal.push_back(true);

				SmallVector<string> exprs;
				exprs.reserve(array_size);
				auto &c = get<SPIRConstant>(var.initializer);
				for (uint32_t j = 0; j < array_size; j++)
					exprs.push_back(to_expression(get<SPIRConstant>(c.subconstants[j]).subconstants[i]));
				statement("const ", type_to_glsl(array_type), " ", lut_name, type_to_array_glsl(array_type), " = ",
				          type_to_glsl_constructor(array_type), "(", merge(exprs, ", "), ");");
			}

			for (uint32_t j = 0; j < iteration_count; j++)
			{
				entry_func.fixup_hooks_in.push_back([=, &var]() {
					AccessChainMeta meta;
					auto &c = this->get<SPIRConstant>(var.initializer);

					uint32_t invocation_id = 0;
					uint32_t member_index_id = 0;
					if (is_control_point)
					{
						uint32_t ids = ir.increase_bound_by(3);
						SPIRType uint_type;
						uint_type.basetype = SPIRType::UInt;
						uint_type.width = 32;
						set<SPIRType>(ids, uint_type);
						set<SPIRExpression>(ids + 1, builtin_to_glsl(BuiltInInvocationId, StorageClassInput), ids, true);
						set<SPIRConstant>(ids + 2, ids, i, false);
						invocation_id = ids + 1;
						member_index_id = ids + 2;
					}

					if (is_patch)
					{
						statement("if (gl_InvocationID == 0)");
						begin_scope();
					}

					if (type_is_array && !is_control_point)
					{
						uint32_t indices[2] = { j, i };
						auto chain = access_chain_internal(var.self, indices, 2, ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &meta);
						statement(chain, " = ", lut_name, "[", j, "];");
					}
					else if (is_control_point)
					{
						uint32_t indices[2] = { invocation_id, member_index_id };
						auto chain = access_chain_internal(var.self, indices, 2, 0, &meta);
						statement(chain, " = ", lut_name, "[", builtin_to_glsl(BuiltInInvocationId, StorageClassInput), "];");
					}
					else
					{
						auto chain =
								access_chain_internal(var.self, &i, 1, ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, &meta);
						statement(chain, " = ", to_expression(c.subconstants[i]), ";");
					}

					if (is_patch)
						end_scope();
				});
			}
		}
	}
	else if (is_control_point)
	{
		auto lut_name = join("_", var.self, "_init");
		statement("const ", type_to_glsl(type), " ", lut_name, type_to_array_glsl(type),
		          " = ", to_expression(var.initializer), ";");
		entry_func.fixup_hooks_in.push_back([&, lut_name]() {
			statement(to_expression(var.self), "[gl_InvocationID] = ", lut_name, "[gl_InvocationID];");
		});
	}
	else if (has_decoration(var.self, DecorationBuiltIn) &&
	         BuiltIn(get_decoration(var.self, DecorationBuiltIn)) == BuiltInSampleMask)
	{
		// We cannot copy the array since gl_SampleMask is unsized in GLSL. Unroll time! <_<
		entry_func.fixup_hooks_in.push_back([&] {
			auto &c = this->get<SPIRConstant>(var.initializer);
			uint32_t num_constants = uint32_t(c.subconstants.size());
			for (uint32_t i = 0; i < num_constants; i++)
			{
				// Don't use to_expression on constant since it might be uint, just fish out the raw int.
				statement(to_expression(var.self), "[", i, "] = ",
				          convert_to_string(this->get<SPIRConstant>(c.subconstants[i]).scalar_i32()), ";");
			}
		});
	}
	else
	{
		auto lut_name = join("_", var.self, "_init");
		statement("const ", type_to_glsl(type), " ", lut_name,
		          type_to_array_glsl(type), " = ", to_expression(var.initializer), ";");
		entry_func.fixup_hooks_in.push_back([&, lut_name, is_patch]() {
			if (is_patch)
			{
				statement("if (gl_InvocationID == 0)");
				begin_scope();
			}
			statement(to_expression(var.self), " = ", lut_name, ";");
			if (is_patch)
				end_scope();
		});
	}
}